

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O1

uchar metacall_value_cast_bool(void **v)

{
  uchar uVar1;
  type_id tVar2;
  value pvVar3;
  undefined8 unaff_RBX;
  type_id id;
  value unaff_retaddr;
  
  id = (type_id)((ulong)unaff_RBX >> 0x20);
  tVar2 = value_type_id(*v);
  if (tVar2 != 0) {
    pvVar3 = value_type_cast(unaff_retaddr,id);
    if (pvVar3 != (value)0x0) {
      *v = pvVar3;
    }
  }
  uVar1 = value_to_bool(*v);
  return uVar1;
}

Assistant:

boolean metacall_value_cast_bool(void **v)
{
	if (value_type_id(*v) != TYPE_BOOL)
	{
		value v_cast = value_type_cast(*v, TYPE_BOOL);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_bool(*v);
}